

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

_Bool ts_node_child_iterator_next(NodeChildIterator *self,TSNode *result)

{
  Subtree *pSVar1;
  TSNode *pTVar2;
  _Bool _Var3;
  Length LVar4;
  void *local_110;
  uint32_t local_108;
  Subtree local_a8;
  Subtree SStack_a0;
  Subtree local_98;
  Subtree SStack_90;
  Length local_88;
  undefined8 local_78;
  uint32_t local_70;
  void *local_68;
  undefined4 local_60;
  Length local_58;
  undefined8 local_48;
  uint32_t local_40;
  void *local_38;
  uint32_t local_30;
  TSSymbol local_2a;
  Subtree *pSStack_28;
  TSSymbol alias_symbol;
  Subtree *child;
  TSNode *result_local;
  NodeChildIterator *self_local;
  
  if (((self->parent).ptr == (SubtreeHeapData *)0x0) ||
     (self->child_index == ((self->parent).ptr)->child_count)) {
    self_local._7_1_ = false;
  }
  else {
    pSStack_28 = (((self->parent).ptr)->field_17).field_0.children + self->child_index;
    local_2a = 0;
    child = (Subtree *)result;
    result_local = (TSNode *)self;
    _Var3 = ts_subtree_extra(*pSStack_28);
    pTVar2 = result_local;
    if (!_Var3) {
      if (*(long *)(result_local[1].context + 2) != 0) {
        local_2a = *(TSSymbol *)
                    (*(long *)(result_local[1].context + 2) + (ulong)result_local[1].context[0] * 2)
        ;
      }
      result_local[1].context[0] = result_local[1].context[0] + 1;
    }
    if (*(int *)((long)&result_local->tree + 4) != 0) {
      LVar4 = ts_subtree_padding(*pSStack_28);
      local_58.extent.column = LVar4.extent.column;
      local_40 = local_58.extent.column;
      local_58._0_8_ = LVar4._0_8_;
      local_48._0_4_ = local_58.bytes;
      local_48._4_4_ = local_58.extent.row;
      local_60 = *(undefined4 *)&pTVar2->tree;
      local_68 = pTVar2->id;
      local_70 = local_58.extent.column;
      local_78._0_4_ = local_58.bytes;
      local_78._4_4_ = local_58.extent.row;
      local_58 = LVar4;
      local_88 = length_add(*(Length *)&pTVar2->id,LVar4);
      local_38 = (void *)local_88._0_8_;
      local_30 = local_88.extent.column;
      pTVar2->id = (void *)local_88._0_8_;
      *(uint32_t *)&pTVar2->tree = local_88.extent.column;
    }
    pSVar1 = child;
    ts_node_new((TSNode *)&local_a8.data,*(TSTree **)(result_local->context + 2),pSStack_28,
                *(Length *)&result_local->id,local_2a);
    pTVar2 = result_local;
    pSVar1[2] = local_98;
    pSVar1[3] = SStack_90;
    *pSVar1 = local_a8;
    pSVar1[1] = SStack_a0;
    LVar4 = ts_subtree_size(*pSStack_28);
    LVar4 = length_add(*(Length *)&pTVar2->id,LVar4);
    local_110 = LVar4._0_8_;
    local_108 = LVar4.extent.column;
    pTVar2->id = local_110;
    *(uint32_t *)&pTVar2->tree = local_108;
    *(int *)((long)&result_local->tree + 4) = *(int *)((long)&result_local->tree + 4) + 1;
    self_local._7_1_ = true;
  }
  return self_local._7_1_;
}

Assistant:

static inline bool ts_node_child_iterator_next(NodeChildIterator *self, TSNode *result) {
  if (!self->parent.ptr || self->child_index == self->parent.ptr->child_count) return false;
  const Subtree *child = &self->parent.ptr->children[self->child_index];
  TSSymbol alias_symbol = 0;
  if (!ts_subtree_extra(*child)) {
    if (self->alias_sequence) {
      alias_symbol = self->alias_sequence[self->structural_child_index];
    }
    self->structural_child_index++;
  }
  if (self->child_index > 0) {
    self->position = length_add(self->position, ts_subtree_padding(*child));
  }
  *result = ts_node_new(
    self->tree,
    child,
    self->position,
    alias_symbol
  );
  self->position = length_add(self->position, ts_subtree_size(*child));
  self->child_index++;
  return true;
}